

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_TalkFacing(AActor *player)

{
  DAngle DVar1;
  byte unaff_BPL;
  long lVar2;
  FTranslatedLineTarget t;
  undefined8 local_68;
  undefined1 local_60 [16];
  DAngle local_50 [4];
  
  lVar2 = 0;
  do {
    local_60._0_8_ =
         *(double *)((long)P_TalkFacing::angleofs + lVar2) + (player->Angles).Yaw.Degrees;
    local_68 = 0x4041800000000000;
    P_AimLineAttack((AActor *)(local_60 + 8),(DAngle *)player,128.0,
                    (FTranslatedLineTarget *)local_60,local_50,(int)&local_68,(AActor *)0x29,
                    (AActor *)0x0);
    DVar1.Degrees = local_50[0].Degrees;
    if ((AActor *)local_50[0].Degrees != (AActor *)0x0) {
      if (((*(int *)((long)local_50[0].Degrees + 0x1fc) < 1) ||
          ((*(byte *)((long)local_50[0].Degrees + 0x1c9) & 0x80) != 0)) ||
         (*(FStrifeDialogueNode **)((long)local_50[0].Degrees + 0x470) == (FStrifeDialogueNode *)0x0
         )) {
        unaff_BPL = 0;
      }
      else {
        AActor::ConversationAnimation((AActor *)local_50[0].Degrees,0);
        P_StartConversation((AActor *)local_50[0].Degrees,player,true,true);
        unaff_BPL = 1;
      }
    }
    if ((AActor *)DVar1.Degrees != (AActor *)0x0) goto LAB_004128d6;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  unaff_BPL = 0;
LAB_004128d6:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool P_TalkFacing(AActor *player)
{
	static const double angleofs[] = { 0, 90./16, -90./16 };
	FTranslatedLineTarget t;

	for (double angle : angleofs)
	{
		P_AimLineAttack(player, player->Angles.Yaw + angle, TALKRANGE, &t, 35., ALF_FORCENOSMART | ALF_CHECKCONVERSATION | ALF_PORTALRESTRICT);
		if (t.linetarget != NULL)
		{
			if (t.linetarget->health > 0 && // Dead things can't talk.
				!(t.linetarget->flags4 & MF4_INCOMBAT) && // Fighting things don't talk either.
				t.linetarget->Conversation != NULL)
			{
				// Give the NPC a chance to play a brief animation
				t.linetarget->ConversationAnimation(0);
				P_StartConversation(t.linetarget, player, true, true);
				return true;
			}
			return false;
		}
	}
	return false;
}